

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O2

string * __thiscall
BmsDuplicateHeaderException::Message_abi_cxx11_
          (string *__return_storage_ptr__,BmsDuplicateHeaderException *this)

{
  ostream *poVar1;
  stringstream os;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,anon_var_dwarf_33b0b);
  std::operator<<(poVar1,(string *)&this->header_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string
BmsDuplicateHeaderException::Message( void ) const
{
  std::stringstream os;
  os << "ヘッダが複数回指定されました。ヘッダ : " << header_;
  return os.str();
}